

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

Status __thiscall
google::protobuf::(anonymous_namespace)::
Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
          (_anonymous_namespace_ *this,char *args,Edition args_1,char *args_2,Edition args_3)

{
  AlphaNum *in_R9;
  string_view message;
  Edition local_140;
  Edition local_13c;
  string local_138;
  StringifySink local_118;
  StringifySink local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  string_view local_78 [3];
  AlphaNum local_48;
  
  local_140 = args_3;
  local_13c = args_1;
  local_78[0] = absl::lts_20250127::NullSafeStringView(args);
  local_f8.buffer_._M_dataplus._M_p = (pointer)&local_f8.buffer_.field_2;
  local_f8.buffer_.field_2._M_allocated_capacity = 0;
  local_f8.buffer_.field_2._8_8_ = 0;
  local_f8.buffer_._M_string_length = 0;
  local_a8.piece_ =
       absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                 (&local_f8,&local_13c);
  local_d8.piece_ = absl::lts_20250127::NullSafeStringView(args_2);
  local_118.buffer_._M_dataplus._M_p = (pointer)&local_118.buffer_.field_2;
  local_118.buffer_.field_2._M_allocated_capacity = 0;
  local_118.buffer_.field_2._8_8_ = 0;
  local_118.buffer_._M_string_length = 0;
  local_48.piece_ =
       absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                 (&local_118,&local_140);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_138,(lts_20250127 *)local_78,&local_a8,&local_d8,&local_48,in_R9);
  message._M_str = (char *)local_138._M_string_length;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}